

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# routing_table.cpp
# Opt level: O0

void __thiscall
libtorrent::dht::routing_table::log_node_failed(routing_table *this,node_id *nid,node_entry *ne)

{
  dht_logger *pdVar1;
  bool bVar2;
  uint uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int64_t iVar6;
  difference_type in_RCX;
  endpoint *ep;
  span<const_char> in;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_b0;
  rep local_a8;
  endpoint local_8c;
  string local_70;
  aux *local_50;
  char *local_48;
  string local_40;
  node_entry *local_20;
  node_entry *ne_local;
  node_id *nid_local;
  routing_table *this_local;
  
  if ((this->m_log != (dht_logger *)0x0) &&
     (local_20 = ne, ne_local = (node_entry *)nid, nid_local = (node_id *)this,
     uVar3 = (**this->m_log->_vptr_dht_logger)(this->m_log,2), (uVar3 & 1) != 0)) {
    pdVar1 = this->m_log;
    span<char_const>::span<libtorrent::digest32<160l>,char,void>
              ((span<char_const> *)&local_50,(digest32<160L> *)ne_local);
    in.m_len = in_RCX;
    in.m_ptr = local_48;
    libtorrent::aux::to_hex_abi_cxx11_(&local_40,local_50,in);
    uVar4 = ::std::__cxx11::string::c_str();
    node_entry::ep(&local_8c,local_20);
    libtorrent::aux::print_endpoint_abi_cxx11_(&local_70,(aux *)&local_8c,ep);
    uVar5 = ::std::__cxx11::string::c_str();
    uVar3 = node_entry::fail_count(local_20);
    bVar2 = node_entry::pinged(local_20);
    local_b0.__d.__r = (duration)libtorrent::aux::time_now();
    local_a8 = (rep)::std::chrono::operator-(&local_b0,&local_20->first_seen);
    iVar6 = total_seconds<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                      ((duration<long,_std::ratio<1L,_1000000000L>_>)local_a8);
    (*pdVar1->_vptr_dht_logger[1])
              (pdVar1,2,"NODE FAILED id: %s ip: %s fails: %d pinged: %d up-time: %d",uVar4,uVar5,
               (ulong)uVar3,bVar2,(int)iVar6);
    ::std::__cxx11::string::~string((string *)&local_70);
    ::std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void routing_table::log_node_failed(node_id const& nid, node_entry const& ne) const
{
	if (m_log != nullptr && m_log->should_log(dht_logger::routing_table))
	{
		m_log->log(dht_logger::routing_table, "NODE FAILED id: %s ip: %s fails: %d pinged: %d up-time: %d"
			, aux::to_hex(nid).c_str(), aux::print_endpoint(ne.ep()).c_str()
			, ne.fail_count()
			, int(ne.pinged())
			, int(total_seconds(aux::time_now() - ne.first_seen)));
	}
}